

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O0

void __thiscall Minisat::BoolOption::giveRndValue(BoolOption *this,string *optionText)

{
  char *pcVar1;
  string *in_RSI;
  long in_RDI;
  int r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  char *in_stack_ffffffffffffff28;
  allocator *__lhs;
  allocator local_b1;
  string local_b0 [32];
  string local_90 [55];
  allocator local_59;
  string local_58 [32];
  string local_38 [36];
  int local_14;
  string *local_10;
  
  local_10 = in_RSI;
  local_14 = rand();
  if (local_14 % 5 < 2) {
    __rhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_RDI + 8);
    __lhs = &local_b1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,(char *)__rhs,__lhs);
    std::operator+((char *)__lhs,__rhs);
    std::__cxx11::string::operator=(local_10,local_90);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  }
  else {
    pcVar1 = *(char **)(in_RDI + 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,pcVar1,&local_59);
    std::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    std::__cxx11::string::operator=(local_10,local_38);
    std::__cxx11::string::~string(local_38);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  return;
}

Assistant:

void giveRndValue(std::string &optionText)
    {
        int r = rand();
        if (r % 5 > 1) { // more likely to be enabled
            optionText = "-" + std::string(name);
        } else {
            optionText = "-no-" + std::string(name);
        }
    }